

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

uint64_t fio_atol_consume(char **pstr,uint8_t base)

{
  char *pcVar1;
  uint64_t uVar2;
  int iVar3;
  undefined7 in_register_00000031;
  int iVar4;
  
  iVar3 = (int)CONCAT71(in_register_00000031,base);
  uVar2 = 0;
  pcVar1 = *pstr;
  while( true ) {
    iVar4 = (int)*pcVar1;
    if (((iVar4 < 0x30) || (iVar3 + 0x30 <= iVar4)) || ((ulong)(long)~(iVar3 * iVar3) < uVar2))
    break;
    uVar2 = uVar2 * (CONCAT71(in_register_00000031,base) & 0xffffffff) + (ulong)(iVar4 - 0x30);
    *pstr = pcVar1 + 1;
    pcVar1 = pcVar1 + 1;
  }
  return uVar2;
}

Assistant:

FIO_FUNC inline uint64_t fio_atol_consume(char **pstr, uint8_t base) {
  uint64_t result = 0;
  const uint64_t limit = UINT64_MAX - (base * base);
  while (**pstr >= '0' && **pstr < ('0' + base) && result <= (limit)) {
    result = (result * base) + (**pstr - '0');
    ++(*pstr);
  }
  return result;
}